

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O1

void testing::internal::PrintTo(wchar_t *s,ostream *os)

{
  ostream *poVar1;
  size_t len;
  
  if (s != (wchar_t *)0x0) {
    poVar1 = std::ostream::_M_insert<void_const*>(os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," pointing to ",0xd);
    len = wcslen(s);
    PrintCharsAsStringTo<wchar_t>(s,len,os);
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"NULL",4);
  return;
}

Assistant:

void PrintTo(const wchar_t* s, ostream* os) { PrintCStringTo(s, os); }